

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirichlet.cpp
# Opt level: O3

void __thiscall
despot::Dirichlet::Dirichlet(Dirichlet *this,vector<double,_std::allocator<double>_> *alpha)

{
  (this->alpha_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->alpha_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->alpha_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&this->alpha_,alpha);
  return;
}

Assistant:

Dirichlet::Dirichlet(vector<double> alpha) {
	alpha_ = alpha;
}